

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O1

ValueType __thiscall ValueType::MergeWithObject(ValueType *this,ValueType other)

{
  code *pcVar1;
  bool bVar2;
  ValueType VVar3;
  Bits BVar4;
  ObjectType OVar5;
  ObjectType OVar6;
  undefined8 in_RAX;
  undefined4 *puVar7;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType_00;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *this_00;
  undefined8 uStack_28;
  ValueType valueType;
  ValueType other_local;
  ValueType merged;
  
  uStack_28._6_2_ = SUB82((ulong)in_RAX >> 0x30,0);
  uStack_28._0_4_ = (undefined4)in_RAX;
  uStack_28._0_6_ = CONCAT24(other.field_0,(undefined4)uStack_28);
  ValueType((ValueType *)((long)&uStack_28 + 6),(this->field_0).bits | (ushort)other.field_0);
  if ((uStack_28 & 0x10000000000000) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x417,"(merged.OneOn(Bits::Object))","merged.OneOn(Bits::Object)");
    if (!bVar2) goto LAB_00b2228f;
    *puVar7 = 0;
  }
  ValueType((ValueType *)((long)&uStack_28 + 2),(this->field_0).bits & (ushort)other.field_0);
  if ((uStack_28 & 0x100000) == 0) {
    if (((ushort)this->field_0 & 0x10) == 0) {
      if (((ushort)other.field_0 & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                           ,0x444,"(other.OneOn(Bits::Object))","other.OneOn(Bits::Object)");
        if (!bVar2) {
LAB_00b2228f:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
      bVar2 = CanMergeToObject(this);
      if (bVar2) {
LAB_00b22198:
        valueType_00.bits = uStack_28._6_2_;
        goto LAB_00b221bc;
      }
      BVar4 = (this->field_0).bits;
      VVar3 = ToPrimitiveOrObject((ValueType *)((long)&uStack_28 + 4));
      BVar4 = (ushort)VVar3.field_0 | BVar4;
    }
    else {
      bVar2 = CanMergeToObject((ValueType *)((long)&uStack_28 + 4));
      if (bVar2) goto LAB_00b22198;
      VVar3 = ToPrimitiveOrObject(this);
      BVar4 = (ushort)other.field_0 | (ushort)VVar3.field_0;
    }
    this_00 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
              ((long)&uStack_28 + 2);
    ValueType((ValueType *)this_00,BVar4);
  }
  else {
    OVar5 = GetObjectType(this);
    OVar6 = GetObjectType((ValueType *)((long)&uStack_28 + 4));
    if (OVar5 == OVar6) goto LAB_00b22198;
    OVar5 = GetObjectType(this);
    OVar6 = GetObjectType((ValueType *)((long)&uStack_28 + 4));
    OVar5 = TypedArrayMergeMap[OVar5][OVar6];
    if (OVar5 == UninitializedObject) {
      OVar5 = GetObjectType(this);
      if ((OVar5 == UninitializedObject) ||
         (OVar5 = GetObjectType((ValueType *)((long)&uStack_28 + 4)), OVar5 == UninitializedObject))
      {
        OVar5 = GetObjectType(this);
        if ((OVar5 < RegExp) &&
           (OVar5 = GetObjectType((ValueType *)((long)&uStack_28 + 4)), OVar5 < RegExp))
        goto LAB_00b22198;
        ValueType((ValueType *)((long)&uStack_28 + 2),uStack_28._6_2_ | (CanBeTaggedValue|Likely));
        valueType_00.bits = uStack_28._2_2_;
      }
      else {
        bVar2 = IsArrayOrObjectWithArray(this);
        if ((!bVar2) &&
           (bVar2 = IsArrayOrObjectWithArray((ValueType *)((long)&uStack_28 + 4)), !bVar2)) {
          OVar5 = Object;
          goto LAB_00b22184;
        }
        uStack_28._0_4_ = CONCAT22(0x10,(undefined2)uStack_28);
        SetObjectType((ValueType *)((long)&uStack_28 + 2),Object);
        VVar3.field_0 = uStack_28._2_2_;
        Verify((ValueType)uStack_28._2_2_);
        ValueType((ValueType *)((long)&uStack_28 + 2),
                  (ushort)VVar3.field_0 | (CanBeTaggedValue|Likely));
        valueType_00.bits = uStack_28._2_2_;
      }
      Verify((ValueType)valueType_00.field_0);
      goto LAB_00b221bc;
    }
LAB_00b22184:
    this_00 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
              ((long)&uStack_28 + 6);
    SetObjectType((ValueType *)this_00,OVar5);
  }
  valueType_00.field_0 = *this_00;
LAB_00b221bc:
  Verify((ValueType)valueType_00.field_0);
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)valueType_00.field_0;
}

Assistant:

ValueType ValueType::MergeWithObject(const ValueType other) const
{
    ValueType merged(bits | other.bits);
    Assert(merged.OneOn(Bits::Object));

    if(ValueType(bits & other.bits).OneOn(Bits::Object)) // both have the Object bit set
    {
        if (GetObjectType() == other.GetObjectType())
            return Verify(merged);
        const ObjectType typedArrayMergedObjectType =
            TypedArrayMergeMap[static_cast<uint16>(GetObjectType())][static_cast<uint16>(other.GetObjectType())];
        if (typedArrayMergedObjectType != ObjectType::UninitializedObject)
        {
            merged.SetObjectType(typedArrayMergedObjectType);
            return Verify(merged);
        }
        if(GetObjectType() != ObjectType::UninitializedObject && other.GetObjectType() != ObjectType::UninitializedObject)
        {
            // Any two different specific object types (excludes UninitializedObject and Object, which don't indicate any
            // specific type of object) merge to Object since the resulting type is not guaranteed to indicate any specific type
            if (IsArrayOrObjectWithArray() || other.IsArrayOrObjectWithArray())
            {
                return Verify(GetObject(ObjectType::Object).ToLikely());
            }
            merged.SetObjectType(ObjectType::Object);
            return Verify(merged);
        }

        // Since UninitializedObject is a generic object type, when merged with a specific object type, the resulting object
        // type is not guaranteed to be any specific object type. However, since UninitializedObject means that we don't have
        // info about the object type, we can assume that the merged type is likely an object of the specific type.
        //
        // If both were definitely object, we lose the information that the merged type is also definitely object. For now
        // though, it's better to have "likely object of a specific type" than "definitely object of an unknown type". It may
        // eventually become necessary to distinguish these and have a "definitely object, likely of a specific type".
        return
            Verify(
                GetObjectType() > ObjectType::Object || other.GetObjectType() > ObjectType::Object
                    ? merged.ToLikely()
                    : merged);
    }

    if(OneOn(Bits::Object))
    {
        if(other.CanMergeToObject())
            return Verify(merged);
        return Verify(ToPrimitiveOrObject().bits | other.bits); // see ToPrimitiveOrObject
    }
    Assert(other.OneOn(Bits::Object));
    if(CanMergeToObject())
        return Verify(merged);
    return Verify(bits | other.ToPrimitiveOrObject().bits); // see ToPrimitiveOrObject
}